

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.cpp
# Opt level: O3

EStatusCode __thiscall
AbstractContentContext::re
          (AbstractContentContext *this,double inLeft,double inBottom,double inWidth,double inHeight
          )

{
  PrimitiveObjectsWriter *this_00;
  EStatusCode EVar1;
  int iVar2;
  undefined4 extraout_var;
  
  EVar1 = (*this->_vptr_AbstractContentContext[5])();
  if (EVar1 != eSuccess) {
    this->mCurrentStatusCode = EVar1;
  }
  iVar2 = (*this->_vptr_AbstractContentContext[2])(this);
  ResourcesDictionary::AddProcsetResource
            ((ResourcesDictionary *)CONCAT44(extraout_var,iVar2),&KProcsetPDF_abi_cxx11_);
  this_00 = &this->mPrimitiveWriter;
  PrimitiveObjectsWriter::WriteDouble(this_00,inLeft,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inBottom,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inWidth,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteDouble(this_00,inHeight,eTokenSeparatorSpace);
  PrimitiveObjectsWriter::WriteKeyword(this_00,&scAddRectangleToPath_abi_cxx11_);
  return this->mCurrentStatusCode;
}

Assistant:

EStatusCode AbstractContentContext::re(double inLeft,double inBottom, double inWidth,double inHeight)
{
	RenewStreamConnectAndStoreResult();
	AssertProcsetAvailable(KProcsetPDF);

	mPrimitiveWriter.WriteDouble(inLeft);
	mPrimitiveWriter.WriteDouble(inBottom);
	mPrimitiveWriter.WriteDouble(inWidth);
	mPrimitiveWriter.WriteDouble(inHeight);
	mPrimitiveWriter.WriteKeyword(scAddRectangleToPath);
	return GetCurrentStatusCode();
}